

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O2

void __thiscall QPDF_String::writeJSON(QPDF_String *this,int json_version,Writer *p)

{
  bool bVar1;
  __type_conflict1 _Var2;
  Writer *pWVar3;
  string test;
  string candidate;
  string local_38;
  
  getUTF8Val_abi_cxx11_(&candidate,this);
  if (json_version == 1) {
    pWVar3 = JSON::Writer::operator<<(p,"\"");
    JSON::Writer::encode_string(&test,&candidate);
    (*pWVar3->p->_vptr_Pipeline[2])(pWVar3->p,test._M_dataplus._M_p,test._M_string_length);
    JSON::Writer::operator<<(pWVar3,"\"");
  }
  else {
    bVar1 = QUtil::is_utf16(&this->val);
    if (!bVar1) {
      bVar1 = QUtil::is_explicit_utf8(&this->val);
      if (!bVar1) {
        bVar1 = useHexString(this);
        if (!bVar1) {
          test._M_dataplus._M_p = (pointer)&test.field_2;
          test._M_string_length = 0;
          test.field_2._M_local_buf[0] = '\0';
          bVar1 = QUtil::utf8_to_pdf_doc(&candidate,&test,'?');
          if (bVar1) {
            _Var2 = std::operator==(&test,&this->val);
            if (_Var2) {
              pWVar3 = JSON::Writer::operator<<(p,"\"u:");
              JSON::Writer::encode_string(&local_38,&candidate);
              (*pWVar3->p->_vptr_Pipeline[2])
                        (pWVar3->p,local_38._M_dataplus._M_p,local_38._M_string_length);
              JSON::Writer::operator<<(pWVar3,"\"");
              std::__cxx11::string::~string((string *)&local_38);
              goto LAB_001c896f;
            }
          }
          std::__cxx11::string::~string((string *)&test);
        }
        pWVar3 = JSON::Writer::operator<<(p,"\"b:");
        QUtil::hex_encode(&test,&this->val);
        (*pWVar3->p->_vptr_Pipeline[2])(pWVar3->p,test._M_dataplus._M_p,test._M_string_length);
        JSON::Writer::operator<<(pWVar3,"\"");
        goto LAB_001c896f;
      }
    }
    pWVar3 = JSON::Writer::operator<<(p,"\"u:");
    JSON::Writer::encode_string(&test,&candidate);
    (*pWVar3->p->_vptr_Pipeline[2])(pWVar3->p,test._M_dataplus._M_p,test._M_string_length);
    JSON::Writer::operator<<(pWVar3,"\"");
  }
LAB_001c896f:
  std::__cxx11::string::~string((string *)&test);
  std::__cxx11::string::~string((string *)&candidate);
  return;
}

Assistant:

void
QPDF_String::writeJSON(int json_version, JSON::Writer& p)
{
    auto candidate = getUTF8Val();
    if (json_version == 1) {
        p << "\"" << JSON::Writer::encode_string(candidate) << "\"";
    } else {
        // See if we can unambiguously represent as Unicode.
        if (QUtil::is_utf16(this->val) || QUtil::is_explicit_utf8(this->val)) {
            p << "\"u:" << JSON::Writer::encode_string(candidate) << "\"";
            return;
        } else if (!useHexString()) {
            std::string test;
            if (QUtil::utf8_to_pdf_doc(candidate, test, '?') && (test == this->val)) {
                // This is a PDF-doc string that can be losslessly encoded as Unicode.
                p << "\"u:" << JSON::Writer::encode_string(candidate) << "\"";
                return;
            }
        }
        p << "\"b:" << QUtil::hex_encode(val) << "\"";
    }
}